

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParseReturnStatement(ParserImpl *this)

{
  TokenDetail *pTVar1;
  long in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  ParserImpl *in_stack_00000018;
  unique_ptr<luna::ReturnStatement,_std::default_delete<luna::ReturnStatement>_> return_stmt;
  pointer in_stack_ffffffffffffff78;
  ParserImpl *in_stack_ffffffffffffff80;
  TokenDetail *in_stack_ffffffffffffff88;
  TokenDetail *in_stack_ffffffffffffff90;
  
  NextToken(in_stack_ffffffffffffff80);
  if (*(int *)(in_RSI + 0x20) != 0x110) {
    __assert_fail("current_.token_ == Token_Return",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0xe0,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseReturnStatement()"
                 );
  }
  operator_new(0x18);
  luna::ReturnStatement::ReturnStatement
            ((ReturnStatement *)in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  std::unique_ptr<luna::ReturnStatement,std::default_delete<luna::ReturnStatement>>::
  unique_ptr<std::default_delete<luna::ReturnStatement>,void>
            ((unique_ptr<luna::ReturnStatement,_std::default_delete<luna::ReturnStatement>_> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pTVar1 = LookAhead(in_stack_ffffffffffffff80);
  if (pTVar1->token_ != 0x11e) {
    pTVar1 = LookAhead(in_stack_ffffffffffffff80);
    if (pTVar1->token_ != 0x105) {
      pTVar1 = LookAhead(in_stack_ffffffffffffff80);
      if (pTVar1->token_ != 0x113) {
        in_stack_ffffffffffffff90 = LookAhead(in_stack_ffffffffffffff80);
        if (in_stack_ffffffffffffff90->token_ != 0x104) {
          in_stack_ffffffffffffff88 = LookAhead(in_stack_ffffffffffffff80);
          if (in_stack_ffffffffffffff88->token_ != 0x103) {
            in_stack_ffffffffffffff80 = (ParserImpl *)LookAhead(in_stack_ffffffffffffff80);
            if ((in_stack_ffffffffffffff80->current_).line_ != 0x3b) {
              ParseExpList(in_stack_00000018);
              std::unique_ptr<luna::ReturnStatement,_std::default_delete<luna::ReturnStatement>_>::
              operator->((unique_ptr<luna::ReturnStatement,_std::default_delete<luna::ReturnStatement>_>
                          *)0x1d682a);
              std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
                        ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                         in_stack_ffffffffffffff80,
                         (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                         in_stack_ffffffffffffff78);
              std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                        ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                         in_stack_ffffffffffffff90);
            }
            pTVar1 = LookAhead(in_stack_ffffffffffffff80);
            if (pTVar1->token_ == 0x3b) {
              NextToken(in_stack_ffffffffffffff80);
            }
            std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
            unique_ptr<luna::ReturnStatement,std::default_delete<luna::ReturnStatement>,void>
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_ffffffffffffff90,
                       (unique_ptr<luna::ReturnStatement,_std::default_delete<luna::ReturnStatement>_>
                        *)in_stack_ffffffffffffff88);
            goto LAB_001d6884;
          }
        }
      }
    }
  }
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<luna::ReturnStatement,std::default_delete<luna::ReturnStatement>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff90,
             (unique_ptr<luna::ReturnStatement,_std::default_delete<luna::ReturnStatement>_> *)
             in_stack_ffffffffffffff88);
LAB_001d6884:
  std::unique_ptr<luna::ReturnStatement,_std::default_delete<luna::ReturnStatement>_>::~unique_ptr
            ((unique_ptr<luna::ReturnStatement,_std::default_delete<luna::ReturnStatement>_> *)
             in_stack_ffffffffffffff80);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseReturnStatement()
        {
            NextToken();                // skip 'return'
            assert(current_.token_ == Token_Return);

            std::unique_ptr<ReturnStatement> return_stmt(new ReturnStatement(current_.line_));

            if (LookAhead().token_ == Token_EOF ||
                LookAhead().token_ == Token_End ||
                LookAhead().token_ == Token_Until ||
                LookAhead().token_ == Token_Elseif ||
                LookAhead().token_ == Token_Else)
            {
                return std::move(return_stmt);
            }

            if (LookAhead().token_ != ';')
                return_stmt->exp_list_ = ParseExpList();

            if (LookAhead().token_ == ';')
                NextToken();

            return std::move(return_stmt);
        }